

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O2

_Bool trans_srli(DisasContext_conflict12 *ctx,arg_srli *a)

{
  int iVar1;
  TCGContext_conflict11 *tcg_ctx;
  TCGv_i64 t;
  uintptr_t o;
  
  iVar1 = a->shamt;
  if ((iVar1 < 0x40) && (a->rd != 0)) {
    tcg_ctx = ctx->uc->tcg_ctx;
    t = tcg_temp_new_i64(tcg_ctx);
    gen_get_gpr(tcg_ctx,t,a->rs1);
    tcg_gen_shri_i64_riscv64(tcg_ctx,t,t,(long)a->shamt);
    gen_set_gpr(tcg_ctx,a->rd,t);
    tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  }
  return iVar1 < 0x40;
}

Assistant:

static bool trans_srli(DisasContext *ctx, arg_srli *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->shamt >= TARGET_LONG_BITS) {
        return false;
    }

    if (a->rd != 0) {
        TCGv t = tcg_temp_new(tcg_ctx);
        gen_get_gpr(tcg_ctx, t, a->rs1);

        tcg_gen_shri_tl(tcg_ctx, t, t, a->shamt);
        gen_set_gpr(tcg_ctx, a->rd, t);
        tcg_temp_free(tcg_ctx, t);
    } /* NOP otherwise */
    return true;
}